

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandFold(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  uint local_40;
  int c;
  int fVerbose;
  int fCompl;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  c = 0;
  local_40 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"cvh");
      if (iVar1 == -1) {
        if (pAVar3 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Empty network.\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          iVar1 = Abc_NtkIsStrash(pAVar3);
          if (iVar1 == 0) {
            Abc_Print(-1,"Currently only works for structurally hashed circuits.\n");
            pAbc_local._4_4_ = 0;
          }
          else {
            iVar1 = Abc_NtkConstrNum(pAVar3);
            if (iVar1 == 0) {
              Abc_Print(0,"The network has no constraints.\n");
              pAbc_local._4_4_ = 0;
            }
            else {
              iVar1 = Abc_NtkConstrNum(pAVar3);
              iVar2 = Abc_NtkPoNum(pAVar3);
              if (iVar1 == iVar2) {
                Abc_Print(0,"The network has no primary outputs (only constraints).\n");
                pAbc_local._4_4_ = 0;
              }
              else {
                iVar1 = Abc_NtkIsComb(pAVar3);
                if (iVar1 != 0) {
                  Abc_Print(0,"The network is combinational.\n");
                }
                pAVar3 = Abc_NtkDarFold(pAVar3,c,local_40);
                if (pAVar3 == (Abc_Ntk_t *)0x0) {
                  Abc_Print(1,"Transformation has failed.\n");
                  pAbc_local._4_4_ = 0;
                }
                else {
                  Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
                  pAbc_local._4_4_ = 0;
                }
              }
            }
          }
        }
        return pAbc_local._4_4_;
      }
      if (iVar1 != 99) break;
      c = c ^ 1;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) break;
    local_40 = local_40 ^ 1;
  }
  Abc_Print(-2,"usage: fold [-cvh]\n");
  Abc_Print(-2,"\t         folds constraints represented as separate outputs\n");
  Abc_Print(-2,"\t         (constraints fail when any of them becomes 1 in any timeframe)\n");
  pcVar4 = "no";
  if (c != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-c     : toggle complementing constraints while folding [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (local_40 != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandFold( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int fCompl;
    int fVerbose;
    int c;
    extern Abc_Ntk_t * Abc_NtkDarFold( Abc_Ntk_t * pNtk, int fCompl, int fVerbose );
    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fCompl    =   0;
    fVerbose  =   0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "cvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fCompl ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }
    if ( Abc_NtkConstrNum(pNtk) == 0 )
    {
        Abc_Print( 0, "The network has no constraints.\n" );
        return 0;
    }
    if ( Abc_NtkConstrNum(pNtk) == Abc_NtkPoNum(pNtk) )
    {
        Abc_Print( 0, "The network has no primary outputs (only constraints).\n" );
        return 0;
    }
    if ( Abc_NtkIsComb(pNtk) )
        Abc_Print( 0, "The network is combinational.\n" );
    // modify the current network
    pNtkRes = Abc_NtkDarFold( pNtk, fCompl, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( 1,"Transformation has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;
usage:
    Abc_Print( -2, "usage: fold [-cvh]\n" );
    Abc_Print( -2, "\t         folds constraints represented as separate outputs\n" );
    Abc_Print( -2, "\t         (constraints fail when any of them becomes 1 in any timeframe)\n" );
    Abc_Print( -2, "\t-c     : toggle complementing constraints while folding [default = %s]\n", fCompl? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}